

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot_persistence_heat_map.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  Persistence_heat_maps l;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_b0;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "This program creates a gnuplot script from a persistence heat maps stored in a file (the file needs "
             ,100);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "to be created beforehand). Please call the code with the name of a single heat maps file \n"
             ,0x5a);
  if (argc == 2) {
    local_b0.discrete = true;
    local_b0.erase_below_diagonal = false;
    local_b0.kernel.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_b0.kernel.super__Function_base._M_functor._8_8_ = 0;
    local_b0.kernel.super__Function_base._M_manager = (_Manager_type)0x0;
    local_b0.kernel._M_invoker = (_Invoker_type)0x0;
    local_b0.interval.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.interval.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.interval.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0.min_ = 0.0;
    local_b0.max_ = 0.0;
    local_b0.heat_map.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.heat_map.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.heat_map.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0.number_of_functions_for_vectorization = 1;
    local_b0.number_of_functions_for_projections_to_reals = 1;
    Gudhi::Persistence_representations::
    Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
    load_from_file(&local_b0,argv[1]);
    Gudhi::Persistence_representations::
    Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::plot
              (&local_b0,argv[1]);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_b0.heat_map);
    if (local_b0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.weights.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.weights.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.interval.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.interval.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.interval.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.interval.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_b0.kernel.super__Function_base._M_manager)
                ((_Any_data *)&local_b0.kernel,(_Any_data *)&local_b0.kernel,__destroy_functor);
    }
    iVar1 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Wrong parameter list, the program will now terminate \n",0x36)
    ;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program creates a gnuplot script from a persistence heat maps stored in a file (the file needs "
            << "to be created beforehand). Please call the code with the name of a single heat maps file \n";
  if (argc != 2) {
    std::clog << "Wrong parameter list, the program will now terminate \n";
    return 1;
  }
  Persistence_heat_maps l;
  l.load_from_file(argv[1]);
  l.plot(argv[1]);
  return 0;
}